

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::OnSelectExpr(Validator *this,SelectExpr *expr)

{
  Result rhs;
  size_type sVar1;
  reference pvVar2;
  SelectExpr *expr_local;
  Validator *this_local;
  
  sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&expr->result_type);
  if (sVar1 != 0) {
    pvVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](&expr->result_type,0);
    rhs = SharedValidator::OnSelect
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)40>).super_Expr.loc,
                     (Type)pvVar2->enum_);
    Result::operator|=(&this->result_,rhs);
    return (Result)(this->result_).enum_;
  }
  __assert_fail("expr->result_type.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/validator.cc"
                ,0x1d2,
                "virtual Result wabt::(anonymous namespace)::Validator::OnSelectExpr(SelectExpr *)")
  ;
}

Assistant:

Result Validator::OnSelectExpr(SelectExpr* expr) {
  assert(expr->result_type.size());
  result_ |= validator_.OnSelect(expr->loc, expr->result_type[0]);
  // TODO: Existing behavior fails when select fails.
#if 0
  return Result::Ok;
#else
  return result_;
#endif
}